

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  RegularExpressionMatch *this_00;
  bool bVar1;
  bool local_111;
  anon_class_8_1_60cb577c local_f0;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  string *name_local;
  cmRuntimeDependencyArchive *this_local;
  
  this_00 = (RegularExpressionMatch *)(&regexMatch.name.field_2._M_allocated_capacity + 1);
  cmsys::RegularExpressionMatch::RegularExpressionMatch(this_00);
  regexSearch.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)this_00;
  std::__cxx11::string::string((string *)&regexMatch,(string *)name);
  local_f0.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)&regexSearch;
  bVar1 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_f0,&this->PreIncludeRegexes);
  local_111 = false;
  if (!bVar1) {
    local_111 = IsPreExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_f0,&this->PreExcludeRegexes);
  }
  IsPreExcluded(std::__cxx11::string_const&)::~__1
            ((IsPreExcluded_std____cxx11__string_const__ *)&regexSearch);
  return local_111;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };

  return !regexSearch(this->PreIncludeRegexes) &&
    regexSearch(this->PreExcludeRegexes);
}